

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.c
# Opt level: O3

lws_sequencer * lws_seq_create(lws_seq_info_t *i)

{
  lws_context *plVar1;
  char *pcVar2;
  int iVar3;
  lws_seq_t *seq;
  lws_usec_t lVar4;
  
  plVar1 = i->context;
  iVar3 = i->tsi;
  seq = (lws_seq_t *)lws_zalloc(i->user_size + 0xb8,"lws_seq_create");
  if (seq != (lws_seq_t *)0x0) {
    seq->pt = plVar1->pt + iVar3;
    pcVar2 = i->name;
    seq->cb = i->cb;
    seq->name = pcVar2;
    seq->retry = i->retry;
    *i->puser = seq + 1;
    lws_dll2_add_tail((lws_dll2 *)seq,&plVar1->pt[iVar3].seq_owner);
    lVar4 = lws_now_usecs();
    seq->time_created = lVar4;
    iVar3 = lws_seq_queue_event(seq,LWSSEQ_CREATED,(void *)0x0,(void *)0x0);
    if (iVar3 == 0) {
      return seq;
    }
    lws_dll2_remove((lws_dll2 *)seq);
    lws_realloc(seq,0,"lws_free");
  }
  return (lws_sequencer *)0x0;
}

Assistant:

lws_seq_t *
lws_seq_create(lws_seq_info_t *i)
{
	struct lws_context_per_thread *pt = &i->context->pt[i->tsi];
	lws_seq_t *seq = lws_zalloc(sizeof(*seq) + i->user_size, __func__);

	if (!seq)
		return NULL;

	seq->cb = i->cb;
	seq->pt = pt;
	seq->name = i->name;
	seq->retry = i->retry;

	*i->puser = (void *)&seq[1];

	/* add the sequencer to the pt */

	lws_pt_lock(pt, __func__); /* ---------------------------------- pt { */

	lws_dll2_add_tail(&seq->seq_list, &pt->seq_owner);

	lws_pt_unlock(pt); /* } pt ------------------------------------------ */

	seq->time_created = lws_now_usecs();

	/* try to queue the creation cb */

	if (lws_seq_queue_event(seq, LWSSEQ_CREATED, NULL, NULL)) {
		lws_dll2_remove(&seq->seq_list);
		lws_free(seq);

		return NULL;
	}

	return seq;
}